

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O3

bool __thiscall OSSLAES::checkLength(OSSLAES *this,int insize,int minsize,char *operation)

{
  int lineNo;
  char *format;
  
  if (insize < minsize) {
    format = "key data to %s too small";
    lineNo = 0x4f;
  }
  else {
    if ((insize & 7U) == 0) {
      return true;
    }
    format = "key data to %s not aligned";
    lineNo = 0x54;
  }
  softHSMLog(3,"checkLength",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
             ,lineNo,format,operation);
  return false;
}

Assistant:

bool OSSLAES::checkLength(const int insize, const int minsize, const char * const operation) const
{
	if (insize < minsize)
	{
		ERROR_MSG("key data to %s too small", operation);
		return false;
	}
	if ((insize % 8) != 0)
	{
		ERROR_MSG("key data to %s not aligned", operation);
		return false;
	}
	return true;
}